

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefifind.cpp
# Opt level: O2

USTATUS __thiscall
UEFIFind::findFileRecursive
          (UEFIFind *this,UModelIndex index,CBString *hexPattern,UINT8 mode,
          set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
          *files)

{
  UModelIndex index_00;
  undefined8 uVar1;
  int iVar2;
  bool bVar3;
  UINT8 UVar4;
  int iVar5;
  INTN IVar6;
  long lVar7;
  USTATUS UVar8;
  int i_1;
  int __c;
  long lVar9;
  UModelIndex *this_00;
  undefined1 local_128 [32];
  uint64_t uStack_108;
  TreeModel *pTStack_100;
  int local_ec;
  UModelIndex parentFile;
  UByteArray data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> patternMask;
  UByteArray local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pattern;
  TreeModel local_48;
  TreeModel *local_38;
  
  bVar3 = UModelIndex::isValid(&index);
  if (!bVar3) {
    return 0;
  }
  if ((hexPattern->super_tagbstring).slen == 0) {
    return 1;
  }
  pattern.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pattern.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pattern.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  patternMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  patternMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  patternMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = makePattern((CHAR8 *)(hexPattern->super_tagbstring).data,&pattern,&patternMask);
  if (!bVar3) {
    UVar8 = 1;
    goto LAB_00109db3;
  }
  lVar9 = 0;
  for (lVar7 = 0;
      (long)patternMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)patternMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != lVar7; lVar7 = lVar7 + 1) {
    lVar9 = lVar9 + (ulong)(patternMask.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar7] == '\0');
  }
  if (lVar9 != (long)patternMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)patternMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
    local_ec = TreeModel::rowCount(this->model,&index);
    for (__c = 0; iVar5 = TreeModel::rowCount(this->model,&index), iVar2 = local_ec, __c < iVar5;
        __c = __c + 1) {
      TreeModel::index(&local_48,(char *)index.m,__c);
      index_00.i._0_1_ = local_48.markingEnabledFlag;
      index_00.i._1_1_ = local_48.markingDarkModeFlag;
      index_00.i._2_6_ = local_48._10_6_;
      index_00._0_8_ = local_48.rootItem;
      index_00.m = local_38;
      findFileRecursive(this,index_00,hexPattern,mode,files);
    }
    data.d._M_dataplus._M_p = (pointer)&data.d.field_2;
    data.d._M_string_length = 0;
    data.d.field_2._M_local_buf[0] = '\0';
    if (local_ec < 1) {
      if (mode == '\x02') {
        TreeModel::body((UByteArray *)local_128,this->model,&index);
        std::__cxx11::string::_M_assign((string *)&data);
      }
      else {
        if (mode != '\x01') {
          TreeModel::header((UByteArray *)&parentFile,this->model,&index);
          TreeModel::body(&local_88,this->model,&index);
          operator+((UByteArray *)local_128,(UByteArray *)&parentFile,&local_88);
          std::__cxx11::string::_M_assign((string *)&data);
          goto LAB_00109c27;
        }
        TreeModel::header((UByteArray *)local_128,this->model,&index);
        std::__cxx11::string::_M_assign((string *)&data);
      }
LAB_00109bce:
      this_00 = (UModelIndex *)local_128;
LAB_00109c43:
      std::__cxx11::string::~string((string *)this_00);
    }
    else {
      if (mode == '\x03') {
        TreeModel::header((UByteArray *)&parentFile,this->model,&index);
        TreeModel::body(&local_88,this->model,&index);
        operator+((UByteArray *)local_128,(UByteArray *)&parentFile,&local_88);
        std::__cxx11::string::_M_assign((string *)&data);
LAB_00109c27:
        std::__cxx11::string::~string((string *)local_128);
        std::__cxx11::string::~string((string *)&local_88);
        this_00 = &parentFile;
        goto LAB_00109c43;
      }
      if (mode == '\x01') {
        TreeModel::header((UByteArray *)local_128,this->model,&index);
        std::__cxx11::string::_M_assign((string *)&data);
        goto LAB_00109bce;
      }
    }
    IVar6 = findPattern(pattern.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        patternMask.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)pattern.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)pattern.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                        (UINT8 *)data.d._M_dataplus._M_p,(long)(int)data.d._M_string_length,0);
    if (mode == '\x03' && 0 < iVar2) {
      TreeModel::header((UByteArray *)local_128,this->model,&index);
      uVar1 = local_128._8_8_;
      std::__cxx11::string::~string((string *)local_128);
      if ((-1 < IVar6) && (IVar6 < (int)uVar1)) {
LAB_00109ccd:
        UVar4 = TreeModel::type(this->model,&index);
        if (UVar4 == 'B') {
          uStack_108 = 0;
          pTStack_100 = (TreeModel *)0x0;
          local_128._0_4_ = index.r;
          local_128._4_4_ = index.c;
          local_128._8_8_ = index.i;
          local_128._16_8_ = index.m;
          local_128._24_4_ = -1;
          local_128._28_4_ = -1;
          std::
          _Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
          ::_M_insert_unique<std::pair<UModelIndex,UModelIndex>>
                    ((_Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
                      *)files,(pair<UModelIndex,_UModelIndex> *)local_128);
        }
        else {
          TreeModel::findParentOfType(&parentFile,this->model,&index,'B');
          UVar4 = TreeModel::type(this->model,&index);
          if ((UVar4 == 'C') && (UVar4 = TreeModel::subtype(this->model,&index), UVar4 == '\x18')) {
            local_128._16_8_ = parentFile.m;
            local_128._0_4_ = parentFile.r;
            local_128._4_4_ = parentFile.c;
            local_128._8_8_ = parentFile.i;
            local_128._24_4_ = index.r;
            local_128._28_4_ = index.c;
            uStack_108 = index.i;
            pTStack_100 = index.m;
            std::
            _Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
            ::_M_insert_unique<std::pair<UModelIndex,UModelIndex>>
                      ((_Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
                        *)files,(pair<UModelIndex,_UModelIndex> *)local_128);
          }
          else {
            uStack_108 = 0;
            pTStack_100 = (TreeModel *)0x0;
            local_128._0_4_ = parentFile.r;
            local_128._4_4_ = parentFile.c;
            local_128._8_8_ = parentFile.i;
            local_128._16_8_ = parentFile.m;
            local_128._24_4_ = -1;
            local_128._28_4_ = -1;
            std::
            _Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
            ::_M_insert_unique<std::pair<UModelIndex,UModelIndex>>
                      ((_Rb_tree<std::pair<UModelIndex,UModelIndex>,std::pair<UModelIndex,UModelIndex>,std::_Identity<std::pair<UModelIndex,UModelIndex>>,std::less<std::pair<UModelIndex,UModelIndex>>,std::allocator<std::pair<UModelIndex,UModelIndex>>>
                        *)files,(pair<UModelIndex,_UModelIndex> *)local_128);
          }
        }
      }
    }
    else if (-1 < IVar6) goto LAB_00109ccd;
    std::__cxx11::string::~string((string *)&data);
  }
  UVar8 = 0;
LAB_00109db3:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&patternMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pattern.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return UVar8;
}

Assistant:

USTATUS UEFIFind::findFileRecursive(const UModelIndex index, const UString & hexPattern, const UINT8 mode, std::set<std::pair<UModelIndex, UModelIndex> > & files)
{
    if (!index.isValid())
        return U_SUCCESS;

    if (hexPattern.isEmpty())
        return U_INVALID_PARAMETER;

    const char *hexPatternRaw = hexPattern.toLocal8Bit();
    std::vector<UINT8> pattern, patternMask;
    if (!makePattern(hexPatternRaw, pattern, patternMask))
        return U_INVALID_PARAMETER;

    // Check for "all substrings" pattern
    size_t count = 0;
    for (size_t i = 0; i < patternMask.size(); i++)
        if (patternMask[i] == 0)
            count++;
    if (count == patternMask.size())
        return U_SUCCESS;

    bool hasChildren = (model->rowCount(index) > 0);
    for (int i = 0; i < model->rowCount(index); i++) {
        findFileRecursive(index.model()->index(i, index.column(), index), hexPattern, mode, files);
    }

    // TODO: handle a case where an item has both compressed and uncompressed bodies
    UByteArray data;
    if (hasChildren) {
        if (mode == SEARCH_MODE_HEADER)
            data = model->header(index);
        else if (mode == SEARCH_MODE_ALL)
            data = model->header(index) + model->body(index);
    }
    else {
        if (mode == SEARCH_MODE_HEADER)
            data = model->header(index);
        else if (mode == SEARCH_MODE_BODY)
            data = model->body(index);
        else
            data = model->header(index) + model->body(index);
    }

    const UINT8 *rawData = reinterpret_cast<const UINT8 *>(data.constData());
    INTN offset = findPattern(pattern.data(), patternMask.data(), pattern.size(), rawData, data.size(), 0);

    // For patterns that cross header|body boundary, skip patterns entirely located in body, since
    // children search above has already found them.
    if (hasChildren && mode == SEARCH_MODE_ALL && offset >= model->header(index).size()) {
        offset = -1;
    }

    if (offset >= 0) {
        if (model->type(index) != Types::File) {
            UModelIndex parentFile = model->findParentOfType(index, Types::File);
            if (model->type(index) == Types::Section && model->subtype(index) == EFI_SECTION_FREEFORM_SUBTYPE_GUID)
                files.insert(std::pair<UModelIndex, UModelIndex>(parentFile, index));
            else
                files.insert(std::pair<UModelIndex, UModelIndex>(parentFile, UModelIndex()));
        }
        else {
            files.insert(std::pair<UModelIndex, UModelIndex>(index, UModelIndex()));
        }
    }

    return U_SUCCESS;
}